

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<ChannelInfo>::push(vec<ChannelInfo> *this,ChannelInfo *elem)

{
  uint uVar1;
  ChannelInfo *pCVar2;
  ulong uVar3;
  
  uVar1 = this->cap;
  if (this->sz == uVar1) {
    uVar3 = 2;
    if (1 < uVar1) {
      uVar3 = (ulong)(uVar1 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar3;
    pCVar2 = (ChannelInfo *)realloc(this->data,uVar3 << 3);
    this->data = pCVar2;
  }
  uVar1 = this->sz;
  this->sz = uVar1 + 1;
  this->data[uVar1] = *elem;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}